

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::ConstructMemoryLeakReport(MemoryLeakDetector *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *local_20;
  MemoryLeakDetectorNode *leak;
  MemLeakPeriod period_local;
  MemoryLeakDetector *this_local;
  
  local_20 = MemoryLeakDetectorTable::getFirstLeak(&this->memoryTable_,period);
  MemoryLeakOutputStringBuffer::startMemoryLeakReporting(&this->outputBuffer_);
  for (; local_20 != (MemoryLeakDetectorNode *)0x0;
      local_20 = MemoryLeakDetectorTable::getNextLeak(&this->memoryTable_,local_20,period)) {
    MemoryLeakOutputStringBuffer::reportMemoryLeak(&this->outputBuffer_,local_20);
  }
  MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(&this->outputBuffer_);
  return;
}

Assistant:

void MemoryLeakDetector::ConstructMemoryLeakReport(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(period);

    outputBuffer_.startMemoryLeakReporting();

    while (leak) {
        outputBuffer_.reportMemoryLeak(leak);
        leak = memoryTable_.getNextLeak(leak, period);
    }

    outputBuffer_.stopMemoryLeakReporting();
}